

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O2

spv_result_t spvtools::val::MeshShadingPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint id;
  StorageClass SVar6;
  Function *pFVar7;
  Instruction *this;
  char *pcVar8;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  string local_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 0x3b) {
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingEXT);
    if (!bVar2) {
      return SPV_SUCCESS;
    }
    bVar2 = IsInterfaceVariable(_,inst,ExecutionModelMeshEXT);
    bVar3 = IsInterfaceVariable(_,inst,ExecutionModelFragment);
    SVar6 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
    bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,DecorationPerPrimitiveEXT);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    if (!bVar3 || SVar6 == Input) {
      if (!bVar2 || SVar6 == Output) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x10f0,(char *)0x0);
      std::operator<<((ostream *)&local_208,(string *)&local_228);
      std::operator<<((ostream *)&local_208,
                      "PerPrimitiveEXT decoration must be applied only to variables in the Output Storage Class in the Storage Class in the MeshEXT Execution Model."
                     );
      std::__cxx11::string::_M_dispose();
      goto LAB_00594692;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar8 = 
    "PerPrimitiveEXT decoration must be applied only to variables in the Input Storage Class in the Fragment Execution Model."
    ;
  }
  else if (uVar1 == 0x14af) {
    pFVar7 = ValidationState_t::function(_,inst->function_->id_);
    local_268._M_unused._M_object = (void *)0x0;
    local_268._8_8_ = 0;
    local_250 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:101:15)>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:101:15)>
                ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar7->execution_model_limitations_,(value_type *)&local_268);
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_268,&local_268,__destroy_functor);
    }
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar5);
    if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
      uVar5 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar5);
      if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = "Primitive Count must be a 32-bit unsigned int scalar";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = "Vertex Count must be a 32-bit unsigned int scalar";
    }
  }
  else {
    if (uVar1 != 0x14ae) {
      return SPV_SUCCESS;
    }
    pFVar7 = ValidationState_t::function(_,inst->function_->id_);
    local_248._M_unused._M_object = (void *)0x0;
    local_248._8_8_ = 0;
    local_230 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:50:15)>
                ::_M_invoke;
    local_238 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:50:15)>
                ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar7->execution_model_limitations_,(value_type *)&local_248);
    if (local_238 != (code *)0x0) {
      (*local_238)(&local_248,&local_248,__destroy_functor);
    }
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar5);
    if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
      uVar5 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar5);
      if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
        uVar5 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar5);
        if ((bVar2) && (uVar5 = ValidationState_t::GetBitWidth(_,uVar5), uVar5 == 0x20)) {
          if ((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0x40) {
            return SPV_SUCCESS;
          }
          id = Instruction::GetOperandAs<unsigned_int>(inst,3);
          this = ValidationState_t::FindDef(_,id);
          if ((this->inst_).opcode == 0x3b) {
            SVar6 = Instruction::GetOperandAs<spv::StorageClass>(this,2);
            if (SVar6 == StorageClassTaskPayloadWorkgroupEXT) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar8 = "Payload OpVariable must have a storage class of TaskPayloadWorkgroupEXT";
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar8 = "Payload must be the result of a OpVariable";
          }
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar8 = "Group Count Z must be a 32-bit unsigned int scalar";
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar8 = "Group Count Y must be a 32-bit unsigned int scalar";
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = "Group Count X must be a 32-bit unsigned int scalar";
    }
  }
  std::operator<<((ostream *)&local_208,pcVar8);
LAB_00594692:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t MeshShadingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpEmitMeshTasksEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskEXT) {
                  if (message) {
                    *message =
                        "OpEmitMeshTasksEXT requires TaskEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t group_count_x = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(group_count_x) ||
          _.GetBitWidth(group_count_x) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count X must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_y = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(group_count_y) ||
          _.GetBitWidth(group_count_y) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Y must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_z = _.GetOperandTypeId(inst, 2);
      if (!_.IsUnsignedIntScalarType(group_count_z) ||
          _.GetBitWidth(group_count_z) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Z must be a 32-bit unsigned int scalar";
      }

      if (inst->operands().size() == 4) {
        const auto payload = _.FindDef(inst->GetOperandAs<uint32_t>(3));
        if (payload->opcode() != spv::Op::OpVariable) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload must be the result of a OpVariable";
        }
        if (payload->GetOperandAs<spv::StorageClass>(2) !=
            spv::StorageClass::TaskPayloadWorkgroupEXT) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload OpVariable must have a storage class of "
                    "TaskPayloadWorkgroupEXT";
        }
      }
      break;
    }

    case spv::Op::OpSetMeshOutputsEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message =
                        "OpSetMeshOutputsEXT requires MeshEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t vertex_count = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(vertex_count) ||
          _.GetBitWidth(vertex_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Vertex Count must be a 32-bit unsigned int scalar";
      }

      const uint32_t primitive_count = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(primitive_count) ||
          _.GetBitWidth(primitive_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Primitive Count must be a 32-bit unsigned int scalar";
      }

      break;
    }

    case spv::Op::OpWritePackedPrimitiveIndices4x8NV: {
      // No validation rules (for the moment).
      break;
    }
    case spv::Op::OpVariable: {
      if (_.HasCapability(spv::Capability::MeshShadingEXT)) {
        bool meshInterfaceVar =
            IsInterfaceVariable(_, inst, spv::ExecutionModel::MeshEXT);
        bool fragInterfaceVar =
            IsInterfaceVariable(_, inst, spv::ExecutionModel::Fragment);

        const spv::StorageClass storage_class =
            inst->GetOperandAs<spv::StorageClass>(2);
        bool storage_output = (storage_class == spv::StorageClass::Output);
        bool storage_input = (storage_class == spv::StorageClass::Input);

        if (_.HasDecoration(inst->id(), spv::Decoration::PerPrimitiveEXT)) {
          if (fragInterfaceVar && !storage_input) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "PerPrimitiveEXT decoration must be applied only to "
                      "variables in the Input Storage Class in the Fragment "
                      "Execution Model.";
          }

          if (meshInterfaceVar && !storage_output) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << _.VkErrorID(4336)
                   << "PerPrimitiveEXT decoration must be applied only to "
                      "variables in the Output Storage Class in the "
                      "Storage Class in the MeshEXT Execution Model.";
          }
        }
      }
      break;
    }
    default:
      break;
  }

  return SPV_SUCCESS;
}